

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QMakeEvaluator::Location>::reallocateAndGrow
          (QArrayDataPointer<QMakeEvaluator::Location> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMakeEvaluator::Location> *old)

{
  QArrayData *pQVar1;
  Location *pLVar2;
  bool bVar3;
  qsizetype qVar4;
  qsizetype toCopy;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QArrayDataPointer<QMakeEvaluator::Location> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QMakeEvaluator::Location> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar4 = 0;
        lVar5 = 0;
      }
      else {
        qVar4 = pQVar1->alloc;
        lVar5 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4);
      }
      auVar6 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x10,qVar4 + n + lVar5,Grow);
      this->d = (Data *)auVar6._0_8_;
      this->ptr = (Location *)auVar6._8_8_;
      goto LAB_00276551;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (Location *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  if ((this->size != 0) && (lVar5 = this->size + (n >> 0x3f & n), lVar5 != 0)) {
    memcpy(local_48.ptr + local_48.size,this->ptr,lVar5 * 0x10);
    local_48.size = local_48.size + lVar5;
  }
  pQVar1 = &this->d->super_QArrayData;
  pLVar2 = this->ptr;
  *(undefined4 *)&this->d = local_48.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_48.d._4_4_;
  *(undefined4 *)&this->ptr = local_48.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_48.ptr._4_4_;
  qVar4 = this->size;
  this->size = local_48.size;
  local_48.d = (Data *)pQVar1;
  local_48.ptr = pLVar2;
  local_48.size = qVar4;
  if (old != (QArrayDataPointer<QMakeEvaluator::Location> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pLVar2;
    local_48.size = old->size;
    old->size = qVar4;
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x10,0x10);
    }
  }
LAB_00276551:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }